

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementUtilities.cpp
# Opt level: O3

Element * Rml::ElementUtilities::GetElementById(Element *root_element,String *id)

{
  size_t __n;
  int iVar1;
  int iVar2;
  String *pSVar3;
  int i;
  Element *this;
  SearchQueue search_queue;
  Element *local_88;
  Element *local_80;
  _Deque_base<Rml::Element_*,_std::allocator<Rml::Element_*>_> local_78;
  
  local_78._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_80 = root_element;
  ::std::_Deque_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>::_M_initialize_map
            (&local_78,0);
  if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_78._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    ::std::deque<Rml::Element*,std::allocator<Rml::Element*>>::_M_push_back_aux<Rml::Element*const&>
              ((deque<Rml::Element*,std::allocator<Rml::Element*>> *)&local_78,&local_80);
  }
  else {
    *local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = root_element;
    local_78._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_78._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_78._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      this = *local_78._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_78._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_78._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_78._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_78._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_78._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_78._M_impl.super__Deque_impl_data._M_start._M_last =
             local_78._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
        local_78._M_impl.super__Deque_impl_data._M_start._M_first =
             local_78._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_78._M_impl.super__Deque_impl_data._M_start._M_node =
             local_78._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_78._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_78._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      pSVar3 = Element::GetId_abi_cxx11_(this);
      __n = pSVar3->_M_string_length;
      if (__n == id->_M_string_length) {
        if (__n == 0) goto LAB_00232227;
        iVar1 = bcmp((pSVar3->_M_dataplus)._M_p,(id->_M_dataplus)._M_p,__n);
        if (iVar1 == 0) goto LAB_00232227;
      }
      iVar1 = 0;
      while( true ) {
        iVar2 = Element::GetNumChildren(this,false);
        if (iVar2 <= iVar1) break;
        local_88 = Element::GetChild(this,iVar1);
        ::std::deque<Rml::Element*,std::allocator<Rml::Element*>>::emplace_back<Rml::Element*>
                  ((deque<Rml::Element*,std::allocator<Rml::Element*>> *)&local_78,&local_88);
        iVar1 = iVar1 + 1;
      }
    } while (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_78._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  this = (Element *)0x0;
LAB_00232227:
  ::std::_Deque_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>::~_Deque_base(&local_78);
  return this;
}

Assistant:

Element* ElementUtilities::GetElementById(Element* root_element, const String& id)
{
	// Breadth first search on elements for the corresponding id
	typedef Queue<Element*> SearchQueue;
	SearchQueue search_queue;
	search_queue.push(root_element);

	while (!search_queue.empty())
	{
		Element* element = search_queue.front();
		search_queue.pop();

		if (element->GetId() == id)
		{
			return element;
		}

		// Add all children to search
		for (int i = 0; i < element->GetNumChildren(); i++)
			search_queue.push(element->GetChild(i));
	}

	return nullptr;
}